

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

int __thiscall Map::GenerateItemID(Map *this)

{
  bool bVar1;
  reference psVar2;
  element_type *peVar3;
  undefined1 local_40 [8];
  shared_ptr<Map_Item> item;
  const_iterator __end1;
  const_iterator __begin1;
  list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *__range1;
  int lowest_free_id;
  Map *this_local;
  
  __range1._4_4_ = 1;
  do {
    __end1 = std::__cxx11::
             list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::begin
                       (&this->items);
    item.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::__cxx11::list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
         ::end(&this->items);
    while( true ) {
      bVar1 = std::operator!=(&__end1,(_Self *)&item.
                                                super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount);
      if (!bVar1) {
        return __range1._4_4_;
      }
      psVar2 = std::_List_const_iterator<std::shared_ptr<Map_Item>_>::operator*(&__end1);
      std::shared_ptr<Map_Item>::shared_ptr((shared_ptr<Map_Item> *)local_40,psVar2);
      peVar3 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )local_40);
      bVar1 = peVar3->uid == __range1._4_4_;
      if (bVar1) {
        peVar3 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_40);
        __range1._4_4_ = peVar3->uid + 1;
      }
      std::shared_ptr<Map_Item>::~shared_ptr((shared_ptr<Map_Item> *)local_40);
      if (bVar1) break;
      std::_List_const_iterator<std::shared_ptr<Map_Item>_>::operator++(&__end1);
    }
  } while( true );
}

Assistant:

int Map::GenerateItemID() const
{
	int lowest_free_id = 1;
	restart_loop:
	UTIL_FOREACH(this->items, item)
	{
		if (item->uid == lowest_free_id)
		{
			lowest_free_id = item->uid + 1;
			goto restart_loop;
		}
	}
	return lowest_free_id;
}